

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vpdi(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int iVar1;
  int iVar2;
  int iVar3;
  TCGv_i64 dst;
  TCGv_i64 dst_00;
  uintptr_t o_2;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_m4,FLD_C_b4);
  iVar2 = get_field1(s,FLD_O_m4,FLD_C_b4);
  dst = tcg_temp_new_i64(tcg_ctx);
  dst_00 = tcg_temp_new_i64(tcg_ctx);
  iVar3 = get_field1(s,FLD_O_v2,FLD_C_d4);
  read_vec_element_i64(tcg_ctx,dst,(uint8_t)iVar3,(byte)iVar1 >> 2 & 1,MO_64);
  iVar1 = get_field1(s,FLD_O_v3,FLD_C_i3);
  read_vec_element_i64(tcg_ctx,dst_00,(uint8_t)iVar1,(byte)iVar2 & 1,MO_64);
  iVar1 = get_field1(s,FLD_O_v1,FLD_C_b1);
  write_vec_element_i64(tcg_ctx,dst,iVar1,'\0',MO_64);
  iVar1 = get_field1(s,FLD_O_v1,FLD_C_b1);
  write_vec_element_i64(tcg_ctx,dst_00,iVar1,'\x01',MO_64);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(dst_00 + (long)tcg_ctx));
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_vpdi(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t i2 = extract32(get_field(s, m4), 2, 1);
    const uint8_t i3 = extract32(get_field(s, m4), 0, 1);
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

    read_vec_element_i64(tcg_ctx, t0, get_field(s, v2), i2, ES_64);
    read_vec_element_i64(tcg_ctx, t1, get_field(s, v3), i3, ES_64);
    write_vec_element_i64(tcg_ctx, t0, get_field(s, v1), 0, ES_64);
    write_vec_element_i64(tcg_ctx, t1, get_field(s, v1), 1, ES_64);
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    return DISAS_NEXT;
}